

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error t1_allocate_blend(T1_Face face,FT_UInt num_designs,FT_UInt num_axis)

{
  uint uVar1;
  FT_Memory memory;
  FT_String *pFVar2;
  PS_Blend pPVar3;
  PS_FontInfo pPVar4;
  PS_Private pPVar5;
  FT_BBox *pFVar6;
  FT_Fixed *pFVar7;
  long lVar8;
  uint uVar9;
  ulong new_count;
  uint uVar10;
  FT_Error local_34 [2];
  FT_Error error;
  
  memory = (face->root).memory;
  local_34[0] = 0;
  pPVar3 = face->blend;
  if (pPVar3 == (PS_Blend)0x0) {
    pPVar3 = (PS_Blend)ft_mem_alloc(memory,0x300,local_34);
    if (local_34[0] != 0) {
      return local_34[0];
    }
    pPVar3->num_default_design_vector = 0;
    face->blend = pPVar3;
  }
  if (num_designs == 0) {
LAB_0022e603:
    uVar10 = pPVar3->num_axis;
    if (num_axis != 0) {
      if (uVar10 != 0 && uVar10 != num_axis) goto LAB_0022e662;
      pPVar3->num_axis = num_axis;
      uVar10 = num_axis;
    }
    uVar1 = pPVar3->num_designs;
    if ((uVar10 != 0 && (ulong)uVar1 != 0) && (pPVar3->design_pos[0] == (FT_Fixed *)0x0)) {
      pFVar7 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)(uVar10 * uVar1),(void *)0x0,local_34);
      pPVar3->design_pos[0] = pFVar7;
      if (local_34[0] == 0) {
        uVar9 = uVar10;
        for (lVar8 = 0; (ulong)uVar1 - 1 != lVar8; lVar8 = lVar8 + 1) {
          pPVar3->design_pos[lVar8 + 1] = pFVar7 + uVar9;
          uVar9 = uVar9 + uVar10;
        }
      }
    }
  }
  else {
    if (pPVar3->num_designs == 0) {
      new_count = (ulong)num_designs;
      pPVar4 = (PS_FontInfo)ft_mem_realloc(memory,0x38,0,new_count,(void *)0x0,local_34);
      pPVar3->font_infos[1] = pPVar4;
      if (local_34[0] != 0) {
        return local_34[0];
      }
      pPVar5 = (PS_Private)ft_mem_realloc(memory,0xe0,0,new_count,(void *)0x0,local_34);
      pPVar3->privates[1] = pPVar5;
      if (local_34[0] != 0) {
        return local_34[0];
      }
      pFVar6 = (FT_BBox *)ft_mem_realloc(memory,0x20,0,new_count,(void *)0x0,local_34);
      pPVar3->bboxes[1] = pFVar6;
      if (local_34[0] != 0) {
        return local_34[0];
      }
      pFVar7 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)(num_designs * 2),(void *)0x0,local_34);
      pPVar3->weight_vector = pFVar7;
      if (local_34[0] != 0) {
        return local_34[0];
      }
      pPVar3->default_weight_vector = pFVar7 + new_count;
      pPVar3->font_infos[0] = &(face->type1).font_info;
      pPVar3->privates[0] = &(face->type1).private_dict;
      pPVar3->bboxes[0] = &(face->type1).font_bbox;
      for (lVar8 = 0x48; lVar8 - 0x46U <= new_count; lVar8 = lVar8 + 1) {
        pFVar2 = pPVar3->axis_names[lVar8 + -2];
        *(long *)((long)pPVar3 + lVar8 * 8 + -0x118) =
             *(long *)((long)pPVar3 + lVar8 * 8 + -0x120) + 0x38;
        *(long *)((long)pPVar3 + lVar8 * 8 + -0x90) =
             *(long *)((long)pPVar3 + lVar8 * 8 + -0x98) + 0xe0;
        pPVar3->axis_names[lVar8 + -1] = pFVar2 + 0x20;
      }
      pPVar3->num_designs = num_designs;
      goto LAB_0022e603;
    }
    if (pPVar3->num_designs == num_designs) goto LAB_0022e603;
LAB_0022e662:
    local_34[0] = 3;
  }
  return local_34[0];
}

Assistant:

static FT_Error
  t1_allocate_blend( T1_Face  face,
                     FT_UInt  num_designs,
                     FT_UInt  num_axis )
  {
    PS_Blend   blend;
    FT_Memory  memory = face->root.memory;
    FT_Error   error  = FT_Err_Ok;


    blend = face->blend;
    if ( !blend )
    {
      if ( FT_NEW( blend ) )
        goto Exit;

      blend->num_default_design_vector = 0;

      face->blend = blend;
    }

    /* allocate design data if needed */
    if ( num_designs > 0 )
    {
      if ( blend->num_designs == 0 )
      {
        FT_UInt  nn;


        /* allocate the blend `private' and `font_info' dictionaries */
        if ( FT_NEW_ARRAY( blend->font_infos[1], num_designs     ) ||
             FT_NEW_ARRAY( blend->privates  [1], num_designs     ) ||
             FT_NEW_ARRAY( blend->bboxes    [1], num_designs     ) ||
             FT_NEW_ARRAY( blend->weight_vector, num_designs * 2 ) )
          goto Exit;

        blend->default_weight_vector = blend->weight_vector + num_designs;

        blend->font_infos[0] = &face->type1.font_info;
        blend->privates  [0] = &face->type1.private_dict;
        blend->bboxes    [0] = &face->type1.font_bbox;

        for ( nn = 2; nn <= num_designs; nn++ )
        {
          blend->font_infos[nn] = blend->font_infos[nn - 1] + 1;
          blend->privates  [nn] = blend->privates  [nn - 1] + 1;
          blend->bboxes    [nn] = blend->bboxes    [nn - 1] + 1;
        }

        blend->num_designs = num_designs;
      }
      else if ( blend->num_designs != num_designs )
        goto Fail;
    }

    /* allocate axis data if needed */
    if ( num_axis > 0 )
    {
      if ( blend->num_axis != 0 && blend->num_axis != num_axis )
        goto Fail;

      blend->num_axis = num_axis;
    }

    /* allocate the blend design pos table if needed */
    num_designs = blend->num_designs;
    num_axis    = blend->num_axis;
    if ( num_designs && num_axis && blend->design_pos[0] == 0 )
    {
      FT_UInt  n;


      if ( FT_NEW_ARRAY( blend->design_pos[0], num_designs * num_axis ) )
        goto Exit;

      for ( n = 1; n < num_designs; n++ )
        blend->design_pos[n] = blend->design_pos[0] + num_axis * n;
    }

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }